

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_left_delim_join.cpp
# Opt level: O1

void __thiscall
duckdb::LeftDelimJoinLocalState::LeftDelimJoinLocalState
          (LeftDelimJoinLocalState *this,ClientContext *context,PhysicalLeftDelimJoin *delim_join)

{
  vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *pvVar1;
  vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_> *pvVar2;
  const_reference pvVar3;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.batch_index.index + 4) =
       0xffffffff;
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.min_batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.min_batch_index.index + 4) =
       0xffffffff;
  pvVar1 = &(this->super_LocalSinkState).partition_info.partition_data.
            super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>;
  (pvVar1->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->super_LocalSinkState).partition_info.partition_data.
           super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
           super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (undefined1  [16])0x0;
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__LeftDelimJoinLocalState_024a67a8;
  pvVar3 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&(delim_join->super_PhysicalDelimJoin).super_PhysicalOperator.children,0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,
             &(pvVar3->_M_data->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ColumnDataCollection::ColumnDataCollection
            (&this->lhs_data,context,(vector<duckdb::LogicalType,_true> *)&local_40,
             BUFFER_MANAGER_ALLOCATOR);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  (this->append_state).current_chunk_state.handles._M_h._M_buckets =
       &(this->append_state).current_chunk_state.handles._M_h._M_single_bucket;
  (this->append_state).current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->append_state).current_chunk_state.handles._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->append_state).current_chunk_state.handles._M_h._M_element_count = 0;
  (this->append_state).current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])
   &(this->append_state).current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->append_state).current_chunk_state.properties = INVALID;
  pvVar2 = &(this->append_state).vector_data.
            super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>;
  (pvVar2->
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->append_state).vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ColumnDataCollection::InitializeAppend(&this->lhs_data,&this->append_state);
  return;
}

Assistant:

explicit LeftDelimJoinLocalState(ClientContext &context, const PhysicalLeftDelimJoin &delim_join)
	    : lhs_data(context, delim_join.children[0].get().GetTypes()) {
		lhs_data.InitializeAppend(append_state);
	}